

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O2

void __thiscall ManchesterAnalyzer::SynchronizeDifferential(ManchesterAnalyzer *this)

{
  U32 UVar1;
  U32 UVar2;
  pointer puVar3;
  U64 location;
  ulong uVar4;
  pointer puVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  U64 edge_location;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  
  while( true ) {
    while( true ) {
      if (this->mSynchronized != false) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      edge_location = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      location = AnalyzerChannelData::GetSampleNumber();
      uVar4 = location - edge_location;
      UVar1 = this->mT;
      UVar2 = this->mTError;
      if (UVar2 + UVar1 <= uVar4 || uVar4 <= UVar1 - UVar2) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&edge_location);
    }
    if (uVar4 < UVar2 + UVar1 * 2 && UVar1 * 2 - UVar2 < uVar4) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&edge_location);
  this->mSynchronized = true;
  puVar5 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar7 - (long)puVar5;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (puVar7 != puVar5) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              (&locations_to_save,puVar7 + -1);
    puVar5 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar7 = puVar3 + -1;
    (this->mUnsyncedLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
    if (puVar7 != puVar5) {
      puVar7 = puVar3 + -2;
      (this->mUnsyncedLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (locations_to_save.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             locations_to_save.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar6 = (long)locations_to_save.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)locations_to_save.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  for (uVar8 = 0; (uVar6 >> 3 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
    SaveBit(this,locations_to_save.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar8],
            (uint)(uVar8 == 0 & (byte)((uVar4 & 0xffffffff) >> 3) & 0x1f));
  }
  SaveBit(this,location,1);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&locations_to_save.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeDifferential()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;

            bool last_bit_one = false;
            if( mUnsyncedLocations.size() % 2 == 1 )
                last_bit_one = true;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( ( i == 0 ) && ( last_bit_one == true ) )
                    SaveBit( locations_to_save[ i ], 1 );
                else
                    SaveBit( locations_to_save[ i ], 0 );
            }

            SaveBit( next_edge_location, 1 );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}